

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTestTest.cpp
# Opt level: O1

void __thiscall ContainTestTest::ContainTestTest(ContainTestTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ContainTest *pCVar2;
  TestText *pTVar3;
  _Head_base<0UL,_TestText_*,_false> local_a0;
  _Head_base<0UL,_TestText_*,_false> local_98;
  _Head_base<0UL,_oout::ContainTest_*,_false> local_90;
  _Head_base<0UL,_oout::ContainTest_*,_false> local_88;
  string local_80;
  _Head_base<0UL,_const_oout::Test_*,_false> local_60;
  shared_ptr<oout::EqualTest> local_58;
  NamedTest *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<oout::EqualTest> local_38;
  shared_ptr<const_oout::NamedTest> local_28;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTestTest_00197930;
  pCVar2 = (ContainTest *)operator_new(0x18);
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"quick brown fox","");
  oout::ContainTest::ContainTest<char_const*,char_const*>(pCVar2,&local_80,"quick","fox");
  local_88._M_head_impl = pCVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_88);
  TestText::TestText(pTVar3,(shared_ptr<const_oout::Test> *)&local_80);
  local_98._M_head_impl = pTVar3;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
  }
  local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_38,(allocator<oout::EqualTest> *)&local_80,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_98,
             (char (*) [8])0x17da77);
  local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[12],std::shared_ptr<oout::EqualTest>>
            (&local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_28,(allocator<oout::NamedTest> *)&local_80,
             (char (*) [12])"Contain all",&local_38);
  pCVar2 = (ContainTest *)operator_new(0x18);
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"jumps over the lazy dog","");
  oout::ContainTest::ContainTest<char_const*,char_const*>(pCVar2,&local_80,"dog","fox");
  local_90._M_head_impl = pCVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_90);
  TestText::TestText(pTVar3,(shared_ptr<const_oout::Test> *)&local_80);
  local_a0._M_head_impl = pTVar3;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_string_length);
  }
  local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_58,(allocator<oout::EqualTest> *)&local_80,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_a0,
             (char (*) [8])0x17dda4);
  local_48 = (NamedTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[19],std::shared_ptr<oout::EqualTest>>
            (&local_40,&local_48,(allocator<oout::NamedTest> *)&local_80,
             (char (*) [19])"Not contain one of",&local_58);
  std::
  make_unique<oout::NamedTest,char_const(&)[16],std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [16])&local_60,(shared_ptr<const_oout::NamedTest> *)"ContainTestTest",
             &local_28);
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (Test *)0x0;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a0._M_head_impl != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_a0,local_a0._M_head_impl);
  }
  local_a0._M_head_impl = (TestText *)0x0;
  if (local_90._M_head_impl != (ContainTest *)0x0) {
    std::default_delete<oout::ContainTest>::operator()
              ((default_delete<oout::ContainTest> *)&local_90,local_90._M_head_impl);
  }
  if (local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98._M_head_impl != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_98,local_98._M_head_impl);
  }
  local_98._M_head_impl = (TestText *)0x0;
  if (local_88._M_head_impl != (ContainTest *)0x0) {
    std::default_delete<oout::ContainTest>::operator()
              ((default_delete<oout::ContainTest> *)&local_88,local_88._M_head_impl);
  }
  return;
}

Assistant:

ContainTestTest::ContainTestTest()
	: tests(
		make_unique<NamedTest>(
			"ContainTestTest",
			make_shared<const NamedTest>(
				"Contain all",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"quick brown fox",
							"quick",
							"fox"
						)
					),
					"success"
				)
			),
			make_shared<const NamedTest>(
				"Not contain one of",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"jumps over the lazy dog",
							"dog",
							"fox"
						)
					),
					"failure"
				)
			)
		)
	)
{
}